

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyMesh::LoadStateIncrement
          (ChLoadBodyMesh *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  pointer psVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ChStateDelta mDi;
  ChState mx;
  ChState mx_inc;
  int local_d4;
  ChStateDelta local_b0;
  ChState local_98;
  ChState local_80;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  lVar7 = 0;
  uVar5 = 0;
  iVar6 = 0;
  local_d4 = 0;
  while( true ) {
    psVar1 = (this->forces).
             super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->forces).
                      super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
    break;
    iVar3 = (**(code **)(**(long **)((long)&(psVar1->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar7) + 0x30))();
    ChState::ChState(&local_80,(long)iVar3,(ChIntegrable *)0x0);
    iVar3 = (**(code **)(**(long **)((long)&(((this->forces).
                                              super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar7) + 0x30))();
    ChState::ChState(&local_98,(long)iVar3,(ChIntegrable *)0x0);
    iVar3 = (**(code **)(**(long **)((long)&(((this->forces).
                                              super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar7) + 0x38))();
    ChStateDelta::ChStateDelta(&local_b0,(long)iVar3,(ChIntegrable *)0x0);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_68,
               &x->super_ChVectorDynamic<double>,(long)iVar6,
               local_98.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_98.super_ChVectorDynamic<double>,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_68);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_68,
               &dw->super_ChVectorDynamic<double>,(long)local_d4,
               local_b0.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_b0.super_ChVectorDynamic<double>,
               (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_68);
    plVar2 = *(long **)((long)&(((this->forces).
                                 super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar7);
    (**(code **)(*plVar2 + 0x50))(plVar2,&local_98,&local_b0,&local_80);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&x_new->super_ChVectorDynamic<double>,(long)iVar6,
               local_80.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &local_80.super_ChVectorDynamic<double>);
    iVar3 = (**(code **)(**(long **)((long)&(((this->forces).
                                              super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar7) + 0x30))();
    iVar4 = (**(code **)(**(long **)((long)&(((this->forces).
                                              super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar7) + 0x38))();
    local_d4 = local_d4 + iVar4;
    iVar6 = iVar6 + iVar3;
    Eigen::internal::handmade_aligned_free
              (local_b0.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (local_98.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (local_80.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    lVar7 = lVar7 + 0x10;
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void ChLoadBodyMesh::LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    int ndoftotx = 0;
    int ndoftotw = 0;
    for (int i = 0; i < forces.size(); ++i) {
        ChState mx_inc(forces[i]->LoadGet_ndof_x(), nullptr);
        ChState mx(forces[i]->LoadGet_ndof_x(), nullptr);
        ChStateDelta mDi(forces[i]->LoadGet_ndof_w(), nullptr);
        mx = x.segment(ndoftotx, mx.size());
        mDi = dw.segment(ndoftotw, mDi.size());
        forces[i]->LoadStateIncrement(mx, mDi, mx_inc);
        x_new.segment(ndoftotx, mx_inc.size()) = mx_inc;
        ndoftotx += forces[i]->LoadGet_ndof_x();
        ndoftotw += forces[i]->LoadGet_ndof_w();
    }
}